

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void chan_updaterhythm(opl_chip *chip,Bit8u data)

{
  opl_slot *poVar1;
  Bit16s *pBVar2;
  opl_channel *channel;
  long lVar3;
  bool bVar4;
  
  chip->rhy = data & 0x3f;
  if ((data & 0x20) == 0) {
    channel = chip->channel + 6;
    lVar3 = 3;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      channel->chtype = '\0';
      chan_setupalg(channel);
      channel = channel + 1;
    }
    return;
  }
  poVar1 = chip->channel[7].slots[0];
  pBVar2 = &chip->channel[6].slots[1]->out;
  chip->channel[6].out[0] = pBVar2;
  chip->channel[6].out[1] = pBVar2;
  chip->channel[6].out[2] = &chip->zeromod;
  chip->channel[6].out[3] = &chip->zeromod;
  pBVar2 = &poVar1->out;
  chip->channel[7].out[0] = pBVar2;
  chip->channel[7].out[1] = pBVar2;
  pBVar2 = &chip->channel[7].slots[1]->out;
  chip->channel[7].out[2] = pBVar2;
  chip->channel[7].out[3] = pBVar2;
  pBVar2 = &chip->channel[8].slots[0]->out;
  chip->channel[8].out[0] = pBVar2;
  chip->channel[8].out[1] = pBVar2;
  pBVar2 = &chip->channel[8].slots[1]->out;
  chip->channel[8].out[2] = pBVar2;
  chip->channel[8].out[3] = pBVar2;
  for (lVar3 = 0; lVar3 != 0x108; lVar3 = lVar3 + 0x58) {
    *(undefined1 *)((long)chip->channel[6].out + lVar3 + 0x20) = 3;
  }
  chan_setupalg(chip->channel + 6);
  poVar1 = chip->channel[7].slots[0];
  if ((chip->rhy & 1) == 0) {
    eg_keyoff(poVar1,'\x02');
  }
  else {
    eg_keyon(poVar1,'\x02');
  }
  poVar1 = chip->channel[8].slots[1];
  if ((chip->rhy & 2) == 0) {
    eg_keyoff(poVar1,'\x02');
  }
  else {
    eg_keyon(poVar1,'\x02');
  }
  poVar1 = chip->channel[8].slots[0];
  if ((chip->rhy & 4) == 0) {
    eg_keyoff(poVar1,'\x02');
  }
  else {
    eg_keyon(poVar1,'\x02');
  }
  poVar1 = chip->channel[7].slots[1];
  if ((chip->rhy & 8) == 0) {
    eg_keyoff(poVar1,'\x02');
  }
  else {
    eg_keyon(poVar1,'\x02');
  }
  poVar1 = chip->channel[6].slots[0];
  if ((chip->rhy & 0x10) == 0) {
    eg_keyoff(poVar1,'\x02');
    eg_keyoff(chip->channel[6].slots[1],'\x02');
    return;
  }
  eg_keyon(poVar1,'\x02');
  eg_keyon(chip->channel[6].slots[1],'\x02');
  return;
}

Assistant:

void chan_updaterhythm(opl_chip *chip, Bit8u data) {
	chip->rhy = data & 0x3f;
	if (chip->rhy & 0x20) {
		opl_channel *channel6 = &chip->channel[6];
		opl_channel *channel7 = &chip->channel[7];
		opl_channel *channel8 = &chip->channel[8];
		channel6->out[0] = &channel6->slots[1]->out;
		channel6->out[1] = &channel6->slots[1]->out;
		channel6->out[2] = &chip->zeromod;
		channel6->out[3] = &chip->zeromod;
		channel7->out[0] = &channel7->slots[0]->out;
		channel7->out[1] = &channel7->slots[0]->out;
		channel7->out[2] = &channel7->slots[1]->out;
		channel7->out[3] = &channel7->slots[1]->out;
		channel8->out[0] = &channel8->slots[0]->out;
		channel8->out[1] = &channel8->slots[0]->out;
		channel8->out[2] = &channel8->slots[1]->out;
		channel8->out[3] = &channel8->slots[1]->out;
		for (Bit8u chnum = 6; chnum < 9; chnum++) {
			chip->channel[chnum].chtype = ch_drum;
		}
		chan_setupalg(channel6);
		//hh
		if (chip->rhy & 0x01) {
			eg_keyon(channel7->slots[0], egk_drum);
		}
		else {
			eg_keyoff(channel7->slots[0], egk_drum);
		}
		//tc
		if (chip->rhy & 0x02) {
			eg_keyon(channel8->slots[1], egk_drum);
		}
		else {
			eg_keyoff(channel8->slots[1], egk_drum);
		}
		//tom
		if (chip->rhy & 0x04) {
			eg_keyon(channel8->slots[0], egk_drum);
		}
		else {
			eg_keyoff(channel8->slots[0], egk_drum);
		}
		//sd
		if (chip->rhy & 0x08) {
			eg_keyon(channel7->slots[1], egk_drum);
		}
		else {
			eg_keyoff(channel7->slots[1], egk_drum);
		}
		//bd
		if (chip->rhy & 0x10) {
			eg_keyon(channel6->slots[0], egk_drum);
			eg_keyon(channel6->slots[1], egk_drum);
		}
		else {
			eg_keyoff(channel6->slots[0], egk_drum);
			eg_keyoff(channel6->slots[1], egk_drum);
		}
	}
	else {
		for (Bit8u chnum = 6; chnum < 9; chnum++) {
			chip->channel[chnum].chtype = ch_2op;
			chan_setupalg(&chip->channel[chnum]);
		}
	}
}